

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# peer_list.cpp
# Opt level: O2

bool __thiscall libtorrent::aux::peer_list::ban_peer(peer_list *this,torrent_peer *p)

{
  bool bVar1;
  int iVar2;
  
  bVar1 = is_connect_candidate(this,p);
  if (bVar1) {
    iVar2 = 1;
    if (1 < this->m_num_connect_candidates) {
      iVar2 = this->m_num_connect_candidates;
    }
    this->m_num_connect_candidates = iVar2 + -1;
  }
  p->field_0x1e = p->field_0x1e | 8;
  return true;
}

Assistant:

bool peer_list::ban_peer(torrent_peer* p)
	{
		TORRENT_ASSERT(is_single_thread());
		INVARIANT_CHECK;

		TORRENT_ASSERT(p->in_use);

		if (is_connect_candidate(*p))
			update_connect_candidates(-1);

		p->banned = true;
		TORRENT_ASSERT(!is_connect_candidate(*p));
		return true;
	}